

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

void __thiscall
kj::BufferedInputStreamWrapper::~BufferedInputStreamWrapper(BufferedInputStreamWrapper *this)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  (this->super_BufferedInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__BufferedInputStreamWrapper_001c26b8;
  puVar1 = (this->ownedBuffer).ptr;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = (this->ownedBuffer).size_;
    (this->ownedBuffer).ptr = (uchar *)0x0;
    (this->ownedBuffer).size_ = 0;
    pAVar3 = (this->ownedBuffer).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

BufferedInputStreamWrapper::~BufferedInputStreamWrapper() noexcept(false) {}